

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

bool is_date(uint32_t year,Month month,uint32_t day)

{
  bool bVar1;
  
  if (day == 0) goto LAB_001107d0;
  if (month < dec) {
    if ((0xa50U >> (month & 0x1f) & 1) == 0) {
      if (month != feb) goto LAB_0011080d;
      bVar1 = leapyear(year);
      if (day < 0x1e || !bVar1) {
        bVar1 = day < 0x1d || bVar1;
        goto LAB_001107d2;
      }
    }
    else if (day < 0x1f) {
      bVar1 = true;
      if (month < dec) goto LAB_001107d2;
      goto LAB_00110812;
    }
  }
  else {
LAB_0011080d:
    if (day < 0x20) {
LAB_00110812:
      bVar1 = true;
      goto LAB_001107d2;
    }
  }
LAB_001107d0:
  bVar1 = false;
LAB_001107d2:
  return (bool)(0x7b1 < year & bVar1);
}

Assistant:

bool is_date(uint32_t year, Month month, uint32_t day)
{
	bool is_valid = year >= 1970;
	bool is_bad_day = day == 0 ||
		(
			(is_30_day_month(month) && day > 30) ||
			(is_31_day_month(month) && day > 31) ||
			(month == Month::feb && 
				((leapyear(year) && day > 29) || (!leapyear(year) && day > 28)))
			);
	is_valid = is_valid && !is_bad_day;
	return is_valid;
}